

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

void __thiscall kj::ExceptionImpl::~ExceptionImpl(ExceptionImpl *this)

{
  ExceptionImpl *pEVar1;
  ExceptionImpl **ppEVar2;
  ExceptionImpl **ppEVar3;
  long *in_FS_OFFSET;
  Fault f;
  Fault local_10;
  
  *(undefined ***)this = &PTR__ExceptionImpl_00207518;
  anon_unknown_70::validateExceptionPointer(this->nextCurrentException);
  ppEVar2 = (ExceptionImpl **)(*in_FS_OFFSET + -0x10);
  do {
    ppEVar3 = ppEVar2;
    pEVar1 = *ppEVar3;
    if (pEVar1 == (ExceptionImpl *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[50]>
                (&local_10,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
                 ,0x48a,FAILED,(char *)0x0,"\"ExceptionImpl not found on currentException list?\"",
                 (char (*) [50])"ExceptionImpl not found on currentException list?");
      kj::_::Debug::Fault::fatal(&local_10);
    }
    ppEVar2 = &pEVar1->nextCurrentException;
  } while (pEVar1 != this);
  *ppEVar3 = this->nextCurrentException;
  Array<char>::~Array(&(this->whatBuffer).content);
  std::exception::~exception(&this->super_exception);
  Exception::~Exception(&this->super_Exception);
  return;
}

Assistant:

~ExceptionImpl() noexcept {
    // Look for ourselves in the list.
    validateExceptionPointer(nextCurrentException);
    for (auto* ptr = &currentException; *ptr != nullptr; ptr = &(*ptr)->nextCurrentException) {
      if (*ptr == this) {
        *ptr = nextCurrentException;
        return;
      }
    }

    // Possibly the ExceptionImpl was destroyed on a different thread than created it? That's
    // pretty bad, we'd better abort.
    KJ_FAIL_ASSERT("ExceptionImpl not found on currentException list?");
  }